

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall helics::TimeDependencies::addDependency(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  reference pvVar2;
  pointer pDVar3;
  BaseType in_ESI;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_RDI;
  iterator dependencyIterator;
  bool rval;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  dep;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffff98
  ;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffffb0;
  TimeRepresentation<count_time<9,_long>_> local_48;
  byte local_3d;
  BaseType local_3c;
  DependencyInfo *local_38;
  DependencyInfo *local_28;
  DependencyInfo *local_20;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [2];
  GlobalFederateId local_8 [2];
  
  local_8[0].gid = in_ESI;
  bVar1 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::empty
                    ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                     in_stack_ffffffffffffffb0._M_current);
  if (bVar1) {
    std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
    emplace_back<helics::GlobalFederateId&>
              ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
               in_stack_ffffffffffffffb0._M_current,
               (GlobalFederateId *)in_stack_ffffffffffffffa8._M_current);
    pvVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::back
                       (in_RDI);
    pvVar2->dependency = true;
  }
  else {
    local_20 = (DependencyInfo *)
               std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                         (in_stack_ffffffffffffff98);
    local_28 = (DependencyInfo *)
               std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                         (in_stack_ffffffffffffff98);
    local_18[0] = std::
                  lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                            (local_20,local_28,local_8);
    local_38 = (DependencyInfo *)
               std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                         (in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::
            operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_RDI,
                       (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_stack_ffffffffffffff98);
    if (bVar1) {
      std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
      emplace_back<helics::GlobalFederateId&>
                ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                 in_stack_ffffffffffffffb0._M_current,
                 (GlobalFederateId *)in_stack_ffffffffffffffa8._M_current);
      pvVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::back
                         (in_RDI);
      pvVar2->dependency = true;
    }
    else {
      pDVar3 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      local_3c = local_8[0].gid;
      bVar1 = GlobalFederateId::operator==(&pDVar3->fedID,local_8[0]);
      if (bVar1) {
        pDVar3 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        local_3d = pDVar3->dependency & 1;
        pDVar3 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        pDVar3->dependency = true;
        pDVar3 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        local_48 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                          ((TimeRepresentation<count_time<9,_long>_> *)pDVar3,&local_48);
        if (bVar1) {
          pDVar3 = __gnu_cxx::
                   __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator->(local_18);
          (pDVar3->super_TimeData).next.internalTimeCode = -1;
          pDVar3 = __gnu_cxx::
                   __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator->(local_18);
          (pDVar3->super_TimeData).lastGrant.internalTimeCode = 0;
          pDVar3 = __gnu_cxx::
                   __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator->(local_18);
          (pDVar3->super_TimeData).mTimeState = initialized;
          return true;
        }
        return (bool)((local_3d ^ 0xff) & 1);
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>
      ::__normal_iterator<helics::DependencyInfo*>
                ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)in_RDI,
                 (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)in_stack_ffffffffffffff98);
      std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
      emplace<helics::GlobalFederateId&>
                (in_RDI,in_stack_ffffffffffffffa8,(GlobalFederateId *)in_stack_ffffffffffffff98);
      pDVar3 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)&stack0xffffffffffffffb0);
      pDVar3->dependency = true;
    }
  }
  return true;
}

Assistant:

bool TimeDependencies::addDependency(GlobalFederateId gid)

{
    if (dependencies.empty()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependency = true;
        return true;
    }
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep == dependencies.end()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependency = true;
    } else {
        if (dep->fedID == gid) {
            auto rval = dep->dependency;
            dep->dependency = true;
            if (dep->next == Time::maxVal()) {
                dep->next = negEpsilon;
                dep->lastGrant = timeZero;
                dep->mTimeState = TimeState::initialized;
                return true;
            }
            // the dependency is already present
            return !rval;
        }
        auto dependencyIterator = dependencies.emplace(dep, gid);
        dependencyIterator->dependency = true;
    }
    return true;
}